

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void nonius::
     go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
               (configuration *cfg,
               __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
               first,__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                     last,reporter *rep)

{
  bool bVar1;
  duration<double,_std::ratio<1L,_1000000000L>_> *in_RCX;
  rep in_RDX;
  rep in_RSI;
  long in_RDI;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> analysis;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2389:47)_()>_>
  samples;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2384:44)_()>_>
  plan;
  benchmark *bench;
  iterator __end0;
  iterator __begin0;
  vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *__range3;
  parameters *params;
  iterator __end2;
  iterator __begin2;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> *__range2;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> all_params;
  vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> benchmarks;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *in_stack_fffffffffffff9f8;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *analysis_00;
  configuration *in_stack_fffffffffffffa00;
  param_configuration *in_stack_fffffffffffffa08;
  param_configuration *in_stack_fffffffffffffa10;
  configuration *in_stack_fffffffffffffa28;
  configuration *in_stack_fffffffffffffa30;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffa38;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffa40;
  configuration *in_stack_fffffffffffffa48;
  reporter *in_stack_fffffffffffffa50;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_stack_fffffffffffffa80;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_stack_fffffffffffffa88;
  reporter *in_stack_fffffffffffffac0;
  configuration *in_stack_fffffffffffffbe8;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffbf0;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffbf8;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffc10;
  param_configuration *in_stack_fffffffffffffd38;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  local_1a8;
  undefined1 *local_1a0;
  reference local_198;
  parameters *local_190;
  __normal_iterator<nonius::parameters_*,_std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
  local_188;
  undefined1 *local_180;
  undefined1 local_d0 [40];
  undefined1 local_a8 [120];
  configuration *local_30;
  configuration *pcStack_28;
  duration<double,_std::ratio<1L,_1000000000L>_> *local_20;
  rep local_10;
  rep local_8;
  
  local_20 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  reporter::configure(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  detail::measure_environment<std::chrono::_V2::system_clock>(in_stack_fffffffffffffac0);
  reporter::suite_start((reporter *)0x216911);
  local_a8._40_8_ = local_8;
  local_a8._32_8_ = local_10;
  this = (sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)local_a8;
  std::__cxx11::string::string((string *)this,(string *)(in_RDI + 0x78));
  filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
            (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,(string *)this);
  std::__cxx11::string::~string((string *)local_a8);
  param_configuration::param_configuration(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  generate_params(in_stack_fffffffffffffd38);
  param_configuration::~param_configuration((param_configuration *)in_stack_fffffffffffffa00);
  local_180 = local_d0;
  local_188._M_current =
       (parameters *)
       std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::begin
                 ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
                  in_stack_fffffffffffff9f8);
  local_190 = (parameters *)
              std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::end
                        ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
                         in_stack_fffffffffffff9f8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<nonius::parameters_*,_std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
                        *)in_stack_fffffffffffffa00,
                       (__normal_iterator<nonius::parameters_*,_std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
                        *)in_stack_fffffffffffff9f8);
    if (!bVar1) break;
    local_198 = __gnu_cxx::
                __normal_iterator<nonius::parameters_*,_std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
                ::operator*(&local_188);
    reporter::params_start
              ((reporter *)in_stack_fffffffffffffa00,(parameters *)in_stack_fffffffffffff9f8);
    local_1a0 = local_a8 + 0x30;
    local_1a8._M_current =
         (benchmark *)
         std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::begin
                   ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
                    in_stack_fffffffffffff9f8);
    std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::end
              ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
               in_stack_fffffffffffff9f8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                          *)in_stack_fffffffffffffa00,
                         (__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                          *)in_stack_fffffffffffff9f8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
      ::operator*(&local_1a8);
      reporter::benchmark_start
                ((reporter *)in_stack_fffffffffffffa00,(string *)in_stack_fffffffffffff9f8);
      user_code<nonius::go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(nonius::configuration,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::reporter&)::_lambda()_1_>
                ((reporter *)in_stack_fffffffffffffa38._M_current,
                 (anon_class_32_4_9fe3b10c *)in_stack_fffffffffffffa30);
      execution_plan::operator_cast_to_execution_plan
                ((execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
                 this);
      reporter::measurement_start
                ((reporter *)in_stack_fffffffffffffa80._M_current,
                 (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)this);
      execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~execution_plan
                ((execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
                 in_stack_fffffffffffffa00);
      user_code<nonius::go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(nonius::configuration,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::reporter&)::_lambda()_2_>
                ((reporter *)in_stack_fffffffffffffa38._M_current,
                 (anon_class_24_3_b965e527 *)in_stack_fffffffffffffa30);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::begin((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)in_stack_fffffffffffff9f8);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::end((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
             *)in_stack_fffffffffffff9f8);
      std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::allocator
                ((allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)0x216c02);
      std::
      vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
      ::
      vector<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,void>
                ((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                  *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
                 (allocator_type *)in_stack_fffffffffffffa28);
      reporter::measurement_complete
                ((reporter *)in_stack_fffffffffffffa00,&in_stack_fffffffffffff9f8->samples);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
      ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                 *)in_stack_fffffffffffffa10);
      std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~allocator
                ((allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)0x216c54);
      if ((*(byte *)(in_RDI + 0x9b) & 1) == 0) {
        reporter::analysis_start((reporter *)0x216c73);
        configuration::configuration(in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        in_stack_fffffffffffffa30 = pcStack_28;
        in_stack_fffffffffffffa28 = local_30;
        in_stack_fffffffffffffa10 = (param_configuration *)local_a8._96_8_;
        in_stack_fffffffffffffa00 = (configuration *)local_a8._80_8_;
        analysis_00 = (sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
                      local_a8._72_8_;
        std::
        vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
        ::begin((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                 *)in_stack_fffffffffffff9f8);
        std::
        vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
        ::end((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)in_stack_fffffffffffff9f8);
        detail::
        analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
                  (in_stack_fffffffffffffbe8,in_stack_fffffffffffffc10,in_stack_fffffffffffffbf8,
                   in_stack_fffffffffffffbf0);
        configuration::~configuration(in_stack_fffffffffffffa00);
        in_stack_fffffffffffffa40._M_current = local_20;
        sample_analysis::operator_cast_to_sample_analysis(this);
        reporter::analysis_complete((reporter *)in_stack_fffffffffffffa00,analysis_00);
        sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~sample_analysis
                  ((sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)0x216da0)
        ;
        sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::
        ~sample_analysis((sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                          *)0x216dad);
        in_stack_fffffffffffff9f8 = analysis_00;
      }
      reporter::benchmark_complete((reporter *)0x216f4a);
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                 *)in_stack_fffffffffffffa10);
      execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::~execution_plan
                ((execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
                 in_stack_fffffffffffffa00);
      __gnu_cxx::
      __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
      ::operator++(&local_1a8);
    }
    reporter::params_complete((reporter *)0x216fa1);
    __gnu_cxx::
    __normal_iterator<nonius::parameters_*,_std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>_>
    ::operator++(&local_188);
  }
  reporter::suite_complete((reporter *)0x216fc4);
  std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::~vector
            ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
             in_stack_fffffffffffffa10);
  std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::~vector
            ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
             in_stack_fffffffffffffa10);
  return;
}

Assistant:

void go(configuration cfg, Iterator first, Iterator last, reporter& rep) {
        rep.configure(cfg);

        auto env = detail::measure_environment<Clock>(rep);
        rep.suite_start();

        auto benchmarks = filter_benchmarks(first, last, cfg.filter_pattern);
        auto all_params = generate_params(cfg.params);

        for (auto&& params : all_params) {
            rep.params_start(params);
            for (auto&& bench : benchmarks) {
                rep.benchmark_start(bench.name);

                auto plan = user_code(rep, [&]{
                    return bench.template prepare<Clock>(cfg, params, env);
                });

                rep.measurement_start(plan);
                auto samples = user_code(rep, [&]{
                    return plan.template run<Clock>(cfg, env);
                });
                rep.measurement_complete(std::vector<fp_seconds>(samples.begin(), samples.end()));

                if(!cfg.no_analysis) {
                    rep.analysis_start();
                    auto analysis = detail::analyse(cfg, env, samples.begin(), samples.end());
                    rep.analysis_complete(analysis);
                }

                rep.benchmark_complete();
            }
            rep.params_complete();
        }

        rep.suite_complete();
    }